

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::represent(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint Value;
  uint uVar1;
  uint uVar2;
  longlong lVar3;
  size_t sVar4;
  size_t sVar5;
  uint Value_00;
  uint uVar6;
  double dVar7;
  double dVar8;
  ulong extraout_XMM0_Qb;
  char buffer [32];
  Char local_68 [32];
  double local_48;
  ulong uStack_40;
  
  requireDStackAvailable(this,1,"REPRESENT");
  requireDStackDepth(this,2,"REPRESENT");
  requireFStackDepth(this,1,"REPRESENT");
  dVar7 = ForthStack<double>::getTop(&this->fStack);
  ForthStack<double>::pop(&this->fStack);
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,1);
  Value = this->False;
  uVar6 = 0x1f;
  if (uVar1 < 0x1f) {
    uVar6 = uVar1;
  }
  uVar1 = this->True;
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    uStack_40 = extraout_XMM0_Qb ^ 0x8000000000000000;
    local_48 = -dVar7;
    if (-dVar7 <= dVar7) {
      local_48 = dVar7;
    }
    dVar8 = log10(local_48);
    dVar8 = floor(dVar8);
    Value_00 = (int)dVar8 + 1;
    dVar8 = pow(10.0,(double)(int)(((int)dVar8 - uVar6) + 1));
    lVar3 = llround(local_48 / dVar8);
    sprintf((char *)local_68,"%lld",lVar3);
  }
  else {
    memset(local_68,0x30,(ulong)uVar6);
    local_68[uVar6] = '\0';
    Value_00 = 0;
  }
  sVar4 = strlen((char *)local_68);
  if (sVar4 != 0) {
    sVar5 = 0;
    do {
      dataSpaceSet(this,uVar2 + (int)sVar5,local_68[sVar5]);
      sVar5 = sVar5 + 1;
    } while (sVar4 != sVar5);
  }
  if (dVar7 < 0.0) {
    Value = uVar1;
  }
  ForthStack<unsigned_int>::setTop(this_00,1,Value_00);
  ForthStack<unsigned_int>::setTop(this_00,Value);
  ForthStack<unsigned_int>::push(this_00,this->True);
  return;
}

Assistant:

void represent(){
			REQUIRE_DSTACK_AVAILABLE(1, "REPRESENT");
			REQUIRE_DSTACK_DEPTH(2, "REPRESENT");
			REQUIRE_FSTACK_DEPTH(1, "REPRESENT");
			auto number=fStack.getTop();fStack.pop();
			auto length=dStack.getTop();
			auto address = (dStack.getTop(1)); 
			auto Sign=False;
			if(number<0.0){
				Sign=True;
				number=-number;
			}
if(length>31) length=31;
int newLog{};
char buffer[32];
if(number!=0.0){
 double loga=std::log10(number);
 int logaint=static_cast<int>(floor(loga));
 int newlogDiv=logaint-(length-1);
 newLog=logaint+1; 
 double new_a=number/pow(10,newlogDiv);
 auto new_a_round=std::llround(new_a);
 sprintf(buffer,"%lld",new_a_round);
} else {
  std::memset(buffer,'0',length);
  buffer[length]=0;
}
moveIntoDataSpace(address,buffer,std::strlen(buffer));
			if (1){
				dStack.setTop(1,newLog);
				dStack.setTop(Sign);
				dStack.push(True);
			}
		}